

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  Value local_180 [9];
  
  bVar2 = this->field_0x8;
  switch(bVar2) {
  case 1:
    bVar3 = isUInt(this);
    if (bVar3) {
LAB_0011d667:
      return *(UInt *)&this->value_;
    }
    this = local_180;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"LargestInt out of UInt range");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    bVar2 = (this->value_).bool_;
  case 0:
    return (uint)bVar2;
  case 2:
    bVar3 = isUInt(this);
    if (bVar3) goto LAB_0011d667;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
    std::operator<<((ostream *)local_180,"LargestUInt out of UInt range");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((0.0 <= dVar1) && (dVar1 <= 4294967295.0)) {
      return (UInt)(long)dVar1;
    }
    break;
  default:
    goto switchD_0011d613_caseD_4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::operator<<((ostream *)local_180,"double out of UInt range");
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
switchD_0011d613_caseD_4:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::operator<<((ostream *)local_180,"Value is not convertible to UInt.");
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}